

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::append(QByteArray *this,QByteArray *ba)

{
  long lVar1;
  QByteArrayView a;
  bool bVar2;
  qsizetype qVar3;
  QArrayDataPointer<char> *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView in_stack_00000000;
  QByteArray *in_stack_ffffffffffffffb8;
  QByteArrayView *this_00;
  QByteArray *in_stack_ffffffffffffffe0;
  storage_type *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = isNull((QByteArray *)0x4b4524);
  if (!bVar2) {
    bVar2 = isNull((QByteArray *)0x4b4536);
    if (bVar2) {
      bVar2 = QArrayDataPointer<char>::isMutable(in_RSI);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        operator=((QByteArray *)in_RDI,in_stack_ffffffffffffffb8);
      }
      else {
        QByteArrayView::QByteArrayView<QByteArray,_true>(this_00,(QByteArray *)in_RSI);
        assign(in_stack_ffffffffffffffe0,in_stack_00000000);
      }
    }
    else {
      qVar3 = size((QByteArray *)in_RSI);
      if (qVar3 != 0) {
        QByteArrayView::QByteArrayView<QByteArray,_true>(this_00,(QByteArray *)in_RSI);
        a.m_data = in_stack_ffffffffffffffe8;
        a.m_size = (qsizetype)in_stack_ffffffffffffffe0;
        append((QByteArray *)in_RSI,a);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::append(const QByteArray &ba)
{
    if (!ba.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!ba.d.isMutable()))
                assign(ba); // fromRawData, so we do a deep copy
            else
                operator=(ba);
        } else if (ba.size()) {
            append(QByteArrayView(ba));
        }
    }
    return *this;
}